

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaObjectBuilder::classInfoValue
          (QByteArray *__return_storage_ptr__,QMetaObjectBuilder *this,int index)

{
  pointer pQVar1;
  
  if (-1 < index) {
    if ((ulong)(uint)index < (ulong)(this->d->classInfoValues).d.size) {
      pQVar1 = QList<QByteArray>::data(&this->d->classInfoValues);
      QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&pQVar1[(uint)index].d);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaObjectBuilder::classInfoValue(int index) const
{
    if (index >= 0 && index < d->classInfoValues.size())
        return d->classInfoValues[index];
    else
        return QByteArray();
}